

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenEM64T.cpp
# Opt level: O0

void Centaurus::SkipRoutineEM64T<char>::emit(X86Assembler *as)

{
  undefined4 in_stack_fffffffffffffde8;
  uint32_t in_stack_fffffffffffffdec;
  CodeEmitter *this;
  undefined8 in_stack_fffffffffffffdf8;
  undefined8 uVar1;
  uint32_t uVar2;
  CodeEmitter *in_stack_fffffffffffffe00;
  Imm local_1e8;
  Imm local_1d8;
  Imm local_1c8;
  Imm local_1b8;
  undefined1 local_1a8 [24];
  Label looplabel;
  X86Assembler *as_local;
  uint32_t signature;
  
  uVar2 = (uint32_t)((ulong)in_stack_fffffffffffffdf8 >> 0x20);
  looplabel.super_Operand.super_Operand_.field_0._mem.field_2 =
       (anon_union_8_2_78723da6_for_MemData_2)as;
  (*(as->super_Assembler).super_CodeEmitter._vptr_CodeEmitter[7])(local_1a8 + 0x10);
  (**(code **)(*(long *)looplabel.super_Operand.super_Operand_.field_0._mem.field_2 + 0x48))
            (looplabel.super_Operand.super_Operand_.field_0._mem.field_2,local_1a8 + 0x10);
  this = (CodeEmitter *)local_1a8;
  local_1a8._0_8_ = (_func_int **)0x1000032;
  local_1a8._12_4_ = 6;
  local_1a8._8_4_ = 0;
  asmjit::CodeEmitter::emit
            (in_stack_fffffffffffffe00,uVar2,(Operand_ *)this,
             (Operand_ *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
  asmjit::CodeEmitter::emit(this,in_stack_fffffffffffffdec,(Operand_ *)0x166185);
  uVar1 = looplabel.super_Operand.super_Operand_.field_0._mem.field_2;
  asmjit::Imm::Imm(&local_1b8,0x20);
  uVar2 = SUB84(uVar1,4);
  asmjit::CodeEmitter::emit
            (in_stack_fffffffffffffe00,uVar2,(Operand_ *)this,
             (Operand_ *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
  asmjit::CodeEmitter::emit(this,in_stack_fffffffffffffdec,(Operand_ *)0x166221);
  uVar1 = looplabel.super_Operand.super_Operand_.field_0._mem.field_2;
  asmjit::Imm::Imm(&local_1c8,9);
  asmjit::CodeEmitter::emit
            ((CodeEmitter *)uVar1,uVar2,(Operand_ *)this,
             (Operand_ *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
  asmjit::CodeEmitter::emit(this,in_stack_fffffffffffffdec,(Operand_ *)0x1662c3);
  asmjit::Imm::Imm(&local_1d8,10);
  asmjit::CodeEmitter::emit
            ((CodeEmitter *)uVar1,uVar2,(Operand_ *)this,
             (Operand_ *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
  asmjit::CodeEmitter::emit(this,in_stack_fffffffffffffdec,(Operand_ *)0x166365);
  asmjit::Imm::Imm(&local_1e8,0xd);
  asmjit::CodeEmitter::emit
            ((CodeEmitter *)uVar1,uVar2,(Operand_ *)this,
             (Operand_ *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
  asmjit::CodeEmitter::emit(this,in_stack_fffffffffffffdec,(Operand_ *)0x166407);
  asmjit::CodeEmitter::emit(this,in_stack_fffffffffffffdec,(Operand_ *)0x166435);
  return;
}

Assistant:

void SkipRoutineEM64T<TCHAR>::emit(asmjit::X86Assembler& as)
{
    asmjit::Label looplabel = as.newLabel();

    as.bind(looplabel);

    //Read the character from stream and advance the input position
    if (sizeof(TCHAR) == 1)
        as.movzx(CHAR_REG, asmjit::x86::byte_ptr(INPUT_REG, 0));
    else
        as.movzx(CHAR_REG, asmjit::x86::word_ptr(INPUT_REG, 0));
    if (sizeof(TCHAR) == 1)
        as.inc(INPUT_REG);
    else
        as.add(INPUT_REG, 2);

    as.cmp(CHAR_REG, asmjit::Imm(' '));
    as.je(looplabel);
    as.cmp(CHAR_REG, asmjit::Imm('\t'));
    as.je(looplabel);
    as.cmp(CHAR_REG, asmjit::Imm('\n'));
    as.je(looplabel);
    as.cmp(CHAR_REG, asmjit::Imm('\r'));
    as.je(looplabel);

    if (sizeof(TCHAR) == 1)
        as.dec(INPUT_REG);
    else
        as.sub(INPUT_REG, 2);

    /*as.movdqu(LOAD_REG, asmjit::X86Mem(INPUT_REG, 0));
    as.pcmpistri(PATTERN_REG, LOAD_REG, asmjit::Imm(sizeof(TCHAR) == 1 ? 0x14 : 0x15));
    if (sizeof(TCHAR) == 2)
        as.sal(INDEX_REG, 1);
    as.add(INPUT_REG, INDEX_REG);
    as.cmp(INDEX_REG, 15);
    as.jg(looplabel);*/
}